

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O0

double __thiscall icu_63::CalendarAstronomer::getMoonPhase(CalendarAstronomer *this)

{
  double dVar1;
  CalendarAstronomer *this_local;
  
  dVar1 = getMoonAge(this);
  dVar1 = cos(dVar1);
  return (1.0 - dVar1) * 0.5;
}

Assistant:

double CalendarAstronomer::getMoonPhase() {
    // See page 147 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.
    return 0.5 * (1 - cos(getMoonAge()));
}